

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O2

QOperation
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::getOperation
          (char *content,SizeT *offset,SizeT end_offset)

{
  char cVar1;
  QOperation QVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  uVar7 = (ulong)*offset;
LAB_0010fa7e:
  uVar6 = (uint)uVar7;
  if (end_offset <= uVar6) {
    return NoOp;
  }
  cVar1 = content[uVar7];
  switch(cVar1) {
  case '!':
    cVar1 = content[uVar7 + 1];
    QVar2 = NotEqual;
LAB_0010fbb4:
    if (cVar1 == '=') {
      return QVar2;
    }
    return Error;
  case '\"':
  case '#':
  case '$':
  case '\'':
  case ')':
  case ',':
  case '.':
    break;
  case '%':
    return Remainder;
  case '&':
    return (content[uVar7 + 1] != '&') << 3 | And;
  case '(':
    iVar4 = 0;
    uVar5 = uVar7;
    while( true ) {
      do {
        while( true ) {
          uVar5 = uVar5 + 1;
          *offset = (SizeT)uVar5;
          if (end_offset <= uVar5) {
            return Error;
          }
          if (content[uVar5] != '(') break;
          iVar4 = iVar4 + 1;
          uVar7 = uVar5;
        }
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (content[uVar5] != ')');
      if (iVar4 == 0) break;
      iVar4 = iVar4 + -1;
      uVar7 = uVar5;
    }
    goto LAB_0010fa7e;
  case '*':
    return Multiplication;
  case '+':
    bVar3 = isExpression(content,uVar6);
    if (bVar3) {
      return Addition;
    }
    break;
  case '-':
    bVar3 = isExpression(content,uVar6);
    if (bVar3) {
      return Subtraction;
    }
    break;
  case '/':
    return Division;
  default:
    if (cVar1 != '{') {
      if (cVar1 == '<') {
        return (content[uVar7 + 1] != '=') * '\x02' + LessOrEqual;
      }
      if (cVar1 == '=') {
        cVar1 = content[uVar7 + 1];
        QVar2 = Equal;
        goto LAB_0010fbb4;
      }
      if (cVar1 == '>') {
        return (content[uVar7 + 1] != '=') * '\x02' | GreaterOrEqual;
      }
      if (cVar1 == '^') {
        return Exponent;
      }
      if (cVar1 == '|') {
        return (content[uVar7 + 1] != '|') * '\b' + Or;
      }
      break;
    }
    do {
      uVar6 = (int)uVar7 + 1;
      uVar7 = (ulong)uVar6;
      *offset = uVar6;
      if (end_offset <= uVar6) {
        *offset = end_offset;
        return Error;
      }
    } while (content[uVar7] != '}');
    goto LAB_0010fa7e;
  }
  uVar7 = (ulong)(*offset + 1);
  *offset = *offset + 1;
  goto LAB_0010fa7e;
}

Assistant:

static QOperation getOperation(const Char_T *content, SizeT &offset, const SizeT end_offset) noexcept {
        using QOperationSymbol = QOperationSymbol_T<Char_T>;

        while (offset < end_offset) {
            switch (content[offset]) {
                case QOperationSymbol::OrExp: { // ||
                    if (content[(offset + 1)] == QOperationSymbol::OrExp) {
                        return QOperation::Or;
                    }

                    return QOperation::BitwiseOr;
                }

                case QOperationSymbol::AndExp: { // &&
                    if (content[(offset + 1)] == QOperationSymbol::AndExp) {
                        return QOperation::And;
                    }

                    return QOperation::BitwiseAnd;
                }

                case QOperationSymbol::GreaterExp: { // > or >=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::GreaterOrEqual;
                    }

                    return QOperation::Greater;
                }

                case QOperationSymbol::LessExp: { // < or <=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::LessOrEqual;
                    }

                    return QOperation::Less;
                }

                case QOperationSymbol::NotExp: { // !=
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::NotEqual;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::EqualExp: { // ==
                    if (content[(offset + 1)] == QOperationSymbol::EqualExp) {
                        return QOperation::Equal;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::SubtractExp: {
                    if (isExpression(content, offset)) {
                        return QOperation::Subtraction;
                    }

                    break;
                }

                case QOperationSymbol::AddExp: {
                    if (isExpression(content, offset)) {
                        return QOperation::Addition;
                    }

                    break;
                }

                case QOperationSymbol::DivideExp: {
                    return QOperation::Division;
                }

                case QOperationSymbol::MultipleExp: {
                    return QOperation::Multiplication;
                }

                case QOperationSymbol::RemainderExp: {
                    return QOperation::Remainder;
                }

                case QOperationSymbol::ExponentExp: {
                    return QOperation::Exponent;
                }

                case QOperationSymbol::ParenthesesStart: {
                    ++offset;
                    SizeT32 skip{0U};

                    while (offset < end_offset) {
                        if (content[offset] == QOperationSymbol::ParenthesesEnd) {
                            if (skip == 0U) {
                                break;
                            }

                            --skip;
                        } else if (content[offset] == QOperationSymbol::ParenthesesStart) {
                            ++skip;
                        }

                        ++offset;
                    }

                    if (offset < end_offset) {
                        continue;
                    }

                    return QOperation::Error;
                }

                case QOperationSymbol::BracketStart: {
                    do {
                        ++offset;
                    } while ((offset < end_offset) && (content[offset] != QOperationSymbol::BracketEnd));

                    if (offset < end_offset) {
                        continue;
                    }

                    offset = end_offset;
                    return QOperation::Error;
                }

                default: {
                }
            }

            ++offset;
        }

        return QOperation::NoOp;
    }